

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hpp
# Opt level: O0

TaskFuture<void> __thiscall
pearce::ThreadPool::submit<relive::ReLiveDB::refreshStations(std::function<void()>,bool)::__0>
          (ThreadPool *this,anon_class_8_1_8991fb9c_for__M_f *func)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  packaged_task<void_()> *in_RSI;
  element_type *in_RDI;
  TaskFuture<void> TVar1;
  TaskFuture<void> result;
  PackagedTask task;
  type boundTask;
  future<void> *in_stack_ffffffffffffff58;
  TaskFuture<void> *other;
  TaskFuture<void> *in_stack_ffffffffffffff60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
  *this_02;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_gulrak[P]relive_client_src_backend_relivedb_cpp:309:43)_()>
  *in_stack_ffffffffffffff88;
  element_type *in_stack_ffffffffffffff90;
  undefined8 local_28;
  
  this_01 = in_RDI;
  local_28 = std::bind<relive::ReLiveDB::refreshStations(std::function<void()>,bool)::__0>
                       ((anon_class_8_1_8991fb9c_for__M_f *)0x1f6e06);
  this_02 = (ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
             *)&stack0xffffffffffffffc8;
  std::packaged_task<void()>::
  packaged_task<std::_Bind<relive::ReLiveDB::refreshStations(std::function<void()>,bool)::__0()>,void>
            ((packaged_task<void_()> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)in_stack_ffffffffffffff88);
  TaskFuture<void>::TaskFuture(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::future<void>::~future((future<void> *)0x1f6e51);
  this_00 = &(in_RSI->_M_state).
             super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::
  make_unique<pearce::ThreadPool::ThreadTask<std::packaged_task<void()>>,std::packaged_task<void()>>
            (in_RSI);
  other = (TaskFuture<void> *)&stack0xffffffffffffff90;
  std::
  unique_ptr<pearce::ThreadPool::IThreadTask,std::default_delete<pearce::ThreadPool::IThreadTask>>::
  unique_ptr<pearce::ThreadPool::ThreadTask<std::packaged_task<void()>>,std::default_delete<pearce::ThreadPool::ThreadTask<std::packaged_task<void()>>>,void>
            ((unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
              *)this_01,
             (unique_ptr<pearce::ThreadPool::ThreadTask<std::packaged_task<void_()>_>,_std::default_delete<pearce::ThreadPool::ThreadTask<std::packaged_task<void_()>_>_>_>
              *)in_RDI);
  ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
  ::push(this_02,(unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
                  *)in_RSI);
  std::
  unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
  ::~unique_ptr((unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
                 *)this_00);
  std::
  unique_ptr<pearce::ThreadPool::ThreadTask<std::packaged_task<void_()>_>,_std::default_delete<pearce::ThreadPool::ThreadTask<std::packaged_task<void_()>_>_>_>
  ::~unique_ptr((unique_ptr<pearce::ThreadPool::ThreadTask<std::packaged_task<void_()>_>,_std::default_delete<pearce::ThreadPool::ThreadTask<std::packaged_task<void_()>_>_>_>
                 *)this_00);
  TaskFuture<void>::TaskFuture((TaskFuture<void> *)this_00,other);
  TaskFuture<void>::~TaskFuture((TaskFuture<void> *)this_00);
  std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)this_01);
  TVar1.m_future.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  TVar1.m_future.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01
  ;
  return (TaskFuture<void>)
         TVar1.m_future.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto submit(Func&& func, Args&&... args)
    {
        auto boundTask = std::bind(std::forward<Func>(func), std::forward<Args>(args)...);
        using ResultType = std::result_of_t<decltype(boundTask)()>;
        using PackagedTask = std::packaged_task<ResultType()>;
        using TaskType = ThreadTask<PackagedTask>;

        PackagedTask task{std::move(boundTask)};
        TaskFuture<ResultType> result{task.get_future()};
        m_workQueue.push(std::make_unique<TaskType>(std::move(task)));
        return result;
    }